

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error callProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error XVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (long)end - (long)start;
  if (end == (char *)0x0) {
    uVar5 = 0;
  }
  if (start == (char *)0x0) {
    uVar5 = 0;
  }
  if ((parser->m_reparseDeferralEnabled != '\0') && ((parser->m_parsingStatus).finalBuffer == '\0'))
  {
    if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
      uVar2 = 0;
    }
    else {
      uVar2 = (long)parser->m_bufferPtr - (long)parser->m_buffer;
    }
    lVar4 = 0;
    lVar3 = uVar2 - 0x400;
    if (uVar2 < 0x400) {
      lVar3 = lVar4;
    }
    if (parser->m_bufferLim != (char *)0x0) {
      if (parser->m_bufferEnd == (char *)0x0) {
        lVar4 = 0;
      }
      else {
        lVar4 = (long)parser->m_bufferLim - (long)parser->m_bufferEnd;
      }
    }
    if ((uVar5 < parser->m_partialTokenBytesBefore * 2) &&
       ((ulong)(long)parser->m_lastBufferRequestSize <= (ulong)(lVar4 + lVar3))) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
  }
  XVar1 = (*parser->m_processor)(parser,start,end,endPtr);
  if (XVar1 == XML_ERROR_NONE) {
    if (*endPtr == start) {
      parser->m_partialTokenBytesBefore = uVar5;
    }
    else {
      parser->m_partialTokenBytesBefore = 0;
    }
    return XML_ERROR_NONE;
  }
  return XVar1;
}

Assistant:

static enum XML_Error
callProcessor(XML_Parser parser, const char *start, const char *end,
              const char **endPtr) {
  const size_t have_now = EXPAT_SAFE_PTR_DIFF(end, start);

  if (parser->m_reparseDeferralEnabled
      && ! parser->m_parsingStatus.finalBuffer) {
    // Heuristic: don't try to parse a partial token again until the amount of
    // available data has increased significantly.
    const size_t had_before = parser->m_partialTokenBytesBefore;
    // ...but *do* try anyway if we're close to causing a reallocation.
    size_t available_buffer
        = EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
#if XML_CONTEXT_BYTES > 0
    available_buffer -= EXPAT_MIN(available_buffer, XML_CONTEXT_BYTES);
#endif
    available_buffer
        += EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd);
    // m_lastBufferRequestSize is never assigned a value < 0, so the cast is ok
    const bool enough
        = (have_now >= 2 * had_before)
          || ((size_t)parser->m_lastBufferRequestSize > available_buffer);

    if (! enough) {
      *endPtr = start; // callers may expect this to be set
      return XML_ERROR_NONE;
    }
  }
#if defined(XML_TESTING)
  g_bytesScanned += (unsigned)have_now;
#endif
  const enum XML_Error ret = parser->m_processor(parser, start, end, endPtr);
  if (ret == XML_ERROR_NONE) {
    // if we consumed nothing, remember what we had on this parse attempt.
    if (*endPtr == start) {
      parser->m_partialTokenBytesBefore = have_now;
    } else {
      parser->m_partialTokenBytesBefore = 0;
    }
  }
  return ret;
}